

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

Integer pnga_sprs_array_create_from_sparse(Integer s_a,Integer trans)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Integer g_a_00;
  undefined8 *__ptr;
  logical lVar5;
  long lVar6;
  long in_RSI;
  long in_RDI;
  Integer ncols;
  Integer jhi;
  Integer jlo;
  Integer n;
  Integer jdx;
  Integer idx;
  int *sjdx;
  int *sidx;
  int64_t *ljdx;
  int64_t *lidx;
  void *jptr;
  void *iptr;
  char plus [2];
  void *s_data;
  void *g_data;
  Integer elemsize;
  Integer iblock;
  Integer j;
  Integer i;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  Integer ihi;
  Integer ilo;
  Integer idx_size;
  Integer nblock [2];
  Integer two;
  Integer dims [2];
  Integer g_a;
  Integer me;
  Integer nprocs;
  int local_sync_end;
  int local_sync_begin;
  Integer handle;
  Integer *map;
  Integer *in_stack_00000290;
  void *in_stack_00000298;
  Integer *in_stack_000002a0;
  Integer *in_stack_000002a8;
  Integer in_stack_000002b0;
  Integer in_stack_00000410;
  char *in_stack_fffffffffffffeb0;
  Integer in_stack_fffffffffffffeb8;
  Integer *in_stack_fffffffffffffec0;
  Integer in_stack_fffffffffffffec8;
  Integer *in_stack_fffffffffffffed0;
  Integer *in_stack_fffffffffffffed8;
  long lVar7;
  Integer in_stack_fffffffffffffee0;
  long lVar8;
  long local_108;
  long local_100;
  long local_f0;
  long local_e8;
  void *val;
  void *jdx_00;
  void *in_stack_ffffffffffffff30;
  long icol;
  Integer in_stack_ffffffffffffff40;
  Integer local_b8;
  Integer local_b0;
  Integer local_a8;
  long local_a0;
  long local_90;
  long local_88;
  Integer local_80;
  long local_78;
  long local_70;
  undefined8 local_60;
  Integer local_58;
  Integer local_50;
  Integer local_40;
  Integer local_38;
  
  lVar4 = in_RDI + 1000;
  g_a_00 = pnga_pgroup_nnodes(SPA[lVar4].grp);
  local_38 = pnga_pgroup_nodeid(SPA[lVar4].grp);
  iVar3 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  local_60 = 2;
  local_80 = SPA[lVar4].idx_size;
  val = (void *)SPA[lVar4].size;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar1 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffeb0);
  }
  __ptr = (undefined8 *)malloc((g_a_00 + 1) * 8);
  for (icol = 0; icol < g_a_00 + 1; icol = icol + 1) {
    __ptr[icol] = 0;
  }
  if (in_RSI == 0) {
    __ptr[local_38 + 1] = SPA[lVar4].ilo + 1;
  }
  else {
    __ptr[local_38 + 1] = SPA[lVar4].ilo + 1;
  }
  pnga_pgroup_gop((Integer)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                  in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  if (in_RSI == 0) {
    __ptr[g_a_00] = 1;
  }
  else {
    *__ptr = 1;
  }
  local_40 = pnga_create_handle();
  local_58 = SPA[lVar4].idim;
  local_50 = SPA[lVar4].jdim;
  pnga_set_data((Integer)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (in_RSI == 0) {
    local_70 = 1;
    local_78 = g_a_00;
  }
  else {
    local_78 = 1;
    local_70 = g_a_00;
  }
  pnga_set_irreg_distr
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  lVar5 = pnga_allocate(in_stack_00000410);
  if (lVar5 == 0) {
    pnga_error((char *)jptr,(Integer)lidx);
  }
  free(__ptr);
  pnga_zero(g_a_00);
  local_88 = SPA[lVar4].ilo;
  local_90 = SPA[lVar4].ihi;
  if (in_RSI == 0) {
    local_a8 = local_88 + 1;
    local_b8 = local_90 + 1;
    local_a0 = 1;
    local_b0 = SPA[lVar4].jdim;
  }
  else {
    local_a8 = 1;
    local_b8 = SPA[lVar4].idim;
    local_a0 = local_88 + 1;
    local_b0 = local_90 + 1;
  }
  pnga_access_ptr(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
                  in_stack_00000290);
  for (jdx_00 = (void *)0x0; (long)jdx_00 < SPA[lVar4].nblocks; jdx_00 = (void *)((long)jdx_00 + 1))
  {
    pnga_sprs_array_column_distribution
              (in_RDI,SPA[lVar4].blkidx[(long)jdx_00],(Integer *)&stack0xfffffffffffffeb8,
               (Integer *)&stack0xfffffffffffffeb0);
    pnga_sprs_array_access_col_block
              (in_stack_ffffffffffffff40,icol,in_stack_ffffffffffffff30,jdx_00,val);
    for (icol = local_88; icol <= local_90; icol = icol + 1) {
      if (local_80 == 4) {
        iVar1 = *(int *)(local_100 + ((icol + 1) - local_88) * 4);
        iVar2 = *(int *)(local_100 + (icol - local_88) * 4);
        lVar7 = local_108;
        lVar8 = local_100;
        for (in_stack_ffffffffffffff30 = (void *)0x0;
            (long)in_stack_ffffffffffffff30 < (long)(iVar1 - iVar2);
            in_stack_ffffffffffffff30 = (void *)((long)in_stack_ffffffffffffff30 + 1)) {
          lVar6 = (long)*(int *)(lVar7 + ((long)*(int *)(lVar8 + (icol - local_88) * 4) +
                                         (long)in_stack_ffffffffffffff30) * 4);
          if (in_RSI == 0) {
            memcpy((void *)(local_e8 +
                           (long)val *
                           ((icol - local_a8) + 1 +
                           in_stack_ffffffffffffff40 * ((lVar6 - local_a0) + 1))),
                   (void *)(local_f0 +
                           (long)val *
                           ((long)*(int *)(lVar8 + (icol - local_88) * 4) +
                           (long)in_stack_ffffffffffffff30)),(size_t)val);
          }
          else {
            memcpy((void *)(local_e8 +
                           (long)val *
                           (((((icol - local_a0) + 1) * in_stack_ffffffffffffff40 + lVar6) -
                            local_a8) + 1)),
                   (void *)(local_f0 +
                           (long)val *
                           ((long)*(int *)(lVar8 + (icol - local_88) * 4) +
                           (long)in_stack_ffffffffffffff30)),(size_t)val);
          }
        }
      }
      else {
        lVar7 = *(long *)(local_100 + ((icol + 1) - local_88) * 8);
        lVar8 = *(long *)(local_100 + (icol - local_88) * 8);
        for (in_stack_ffffffffffffff30 = (void *)0x0;
            (long)in_stack_ffffffffffffff30 < lVar7 - lVar8;
            in_stack_ffffffffffffff30 = (void *)((long)in_stack_ffffffffffffff30 + 1)) {
          lVar6 = *(long *)(local_108 +
                           (*(long *)(local_100 + (icol - local_88) * 8) +
                           (long)in_stack_ffffffffffffff30) * 8);
          if (in_RSI == 0) {
            memcpy((void *)(local_e8 +
                           (long)val *
                           ((icol - local_a8) + 1 +
                           in_stack_ffffffffffffff40 * ((lVar6 - local_a0) + 1))),
                   (void *)(local_f0 +
                           (long)val *
                           (*(long *)(local_100 + (icol - local_88) * 8) +
                           (long)in_stack_ffffffffffffff30)),(size_t)val);
          }
          else {
            memcpy((void *)(local_e8 +
                           (long)val *
                           (((((icol - local_a0) + 1) * in_stack_ffffffffffffff40 + lVar6) -
                            local_a8) + 1)),
                   (void *)(local_f0 +
                           (long)val *
                           (*(long *)(local_100 + (icol - local_88) * 8) +
                           (long)in_stack_ffffffffffffff30)),(size_t)val);
          }
        }
      }
    }
  }
  pnga_release(local_40,&local_a8,&local_b8);
  if (iVar3 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffeb0);
  }
  return local_40;
}

Assistant:

Integer pnga_sprs_array_create_from_sparse(Integer s_a,
    Integer trans)
{
  Integer *map;
  Integer handle = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer nprocs = pnga_pgroup_nnodes(SPA[handle].grp);
  Integer me = pnga_pgroup_nodeid(SPA[handle].grp);
  Integer g_a;
  Integer dims[2];
  Integer two = 2;
  Integer nblock[2];
  Integer idx_size = SPA[handle].idx_size;
  Integer ilo, ihi;
  Integer lo[2], hi[2], ld;
  Integer i, j, iblock;
  Integer elemsize = SPA[handle].size;
  void *g_data;
  void *s_data;
  char plus[2];

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[handle].grp);

  /* allocate and fill map array to create new GA */
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  for (i=0; i<nprocs+1; i++) map[i] = 0;
  if (trans) {
    map[me+1] = SPA[handle].ilo+1;
  } else {
    map[me+1] = SPA[handle].ilo+1;
  }
  plus[0] = '+';
  plus[1] = '\0';
  if (sizeof(Integer) == 4) {
    pnga_pgroup_gop(SPA[handle].grp, C_INT, map, nprocs+1, plus);
  } else {
    pnga_pgroup_gop(SPA[handle].grp, C_LONG, map, nprocs+1, plus);
  }
  if (trans) {
    map[0] = 1;
  } else {
    map[nprocs] = 1;
  }
  g_a = pnga_create_handle();
  dims[0] = SPA[handle].idim;
  dims[1] = SPA[handle].jdim;
  pnga_set_data(g_a,two,dims,SPA[handle].type);
  if (trans) {
    nblock[0] = 1;
    nblock[1] = nprocs;
  } else {
    nblock[0] = nprocs;
    nblock[1] = 1;
  }
  pnga_set_irreg_distr(g_a, map, nblock);
  if (!pnga_allocate(g_a)) {
    pnga_error("(ga_sprs_array_create_from_sparse) failed to create"
        " dense array",0);
  }
  free(map);
  /* Initialize global array to zero */
  pnga_zero(g_a);
  /* get limits of locally held row block */
  ilo = SPA[handle].ilo;
  ihi = SPA[handle].ihi;
  if (trans) {
    lo[0] = 1;
    hi[0] = SPA[handle].idim;
    lo[1] = ilo+1;
    hi[1] = ihi+1;
  } else {
    lo[0] = ilo+1;
    hi[0] = ihi+1;
    lo[1] = 1;
    hi[1] = SPA[handle].jdim;
  }
  pnga_access_ptr(g_a,lo,hi,&g_data,&ld);
  /* loop over all column blocks in row block and assign values to dense matrix */
  for (iblock=0; iblock<SPA[handle].nblocks; iblock++) {
    void *iptr, *jptr;
    int64_t *lidx, *ljdx;
    int *sidx, *sjdx;
    Integer idx, jdx, n;
    Integer jlo, jhi;
    n = SPA[handle].blkidx[iblock];
    pnga_sprs_array_column_distribution(s_a,n,&jlo,&jhi);
    pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&s_data);
    for (i=ilo; i<=ihi; i++) {
      Integer ncols;
      if (idx_size == 4) {
        sidx = (int*)iptr;
        sjdx = (int*)jptr;
        ncols =  (Integer)(sidx[i+1-ilo]-sidx[i-ilo]);
        for (j=0; j<ncols; j++) {
          jdx = sjdx[sidx[i-ilo]+j];
          if (trans) {
            memcpy(((char*)g_data+elemsize*((i-lo[1]+1)*ld+jdx-lo[0]+1)),
                ((char*)s_data+elemsize*(sidx[i-ilo]+j)),
                (size_t)elemsize);
          }  else {
            memcpy(((char*)g_data+elemsize*(i-lo[0]+1+ld*(jdx-lo[1]+1))),
                ((char*)s_data+elemsize*(sidx[i-ilo]+j)),
                (size_t)elemsize);
          }
        }
      } else {
        lidx = (int64_t*)iptr;
        ljdx = (int64_t*)jptr;
        ncols =  (Integer)(lidx[i+1-ilo]-lidx[i-ilo]);
        for (j=0; j<ncols; j++) {
          jdx = ljdx[lidx[i-ilo]+j];
          if (trans) {
            memcpy(((char*)g_data+elemsize*((i-lo[1]+1)*ld+jdx-lo[0]+1)),
                ((char*)s_data+elemsize*(lidx[i-ilo]+j)),
                (size_t)elemsize);
          }  else {
            memcpy(((char*)g_data+elemsize*(i-lo[0]+1+ld*(jdx-lo[1]+1))),
                ((char*)s_data+elemsize*(lidx[i-ilo]+j)),
                (size_t)elemsize);
          }
        }
      }
    }
  }
  pnga_release(g_a,lo,hi); 
  if (local_sync_end) pnga_pgroup_sync(SPA[handle].grp);
  return g_a;
}